

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::setItemsGeometries(QGraphicsAnchorLayoutPrivate *this,QRectF *geom)

{
  QGraphicsLayoutItem *pQVar1;
  QGraphicsLayoutItem **ppQVar2;
  long lVar3;
  bool bVar4;
  LayoutDirection LVar5;
  AnchorVertex *pAVar6;
  AnchorVertex *pAVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  QSizeF QVar13;
  QSizeF local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  QGraphicsLayoutItem *item;
  qreal right;
  qreal left;
  qreal top;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  top = -NAN;
  left = -NAN;
  right = -NAN;
  lVar8 = 0;
  (*pQVar1->_vptr_QGraphicsLayoutItem[3])(pQVar1,&left,&top,&right,0);
  LVar5 = QGraphicsLayoutPrivate::visualDirection(&this->super_QGraphicsLayoutPrivate);
  if (LVar5 == RightToLeft) {
    uVar9 = SUB84(left,0);
    uVar10 = (undefined4)((ulong)left >> 0x20);
    left = right;
  }
  else {
    uVar9 = SUB84(right,0);
    uVar10 = (undefined4)((ulong)right >> 0x20);
  }
  left = left + geom->xp;
  top = geom->yp + top;
  right = (geom->xp + geom->w) - (double)CONCAT44(uVar10,uVar9);
  ppQVar2 = (this->items).d.ptr;
  lVar3 = (this->items).d.size;
  for (; lVar3 << 3 != lVar8; lVar8 = lVar8 + 8) {
    item = *(QGraphicsLayoutItem **)((long)ppQVar2 + lVar8);
    local_68 = 0.0;
    dStack_60 = 0.0;
    local_78 = 0.0;
    dStack_70 = 0.0;
    local_88.wd = -1.0;
    local_88.ht = -1.0;
    QVar13 = QGraphicsLayoutItem::effectiveSizeHint(item,PreferredSize,&local_88);
    dVar12 = QVar13.ht;
    dVar11 = QVar13.wd;
    bVar4 = QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::contains
                      ((QHash<QGraphicsLayoutItem_*,_QHashDummyValue> *)&this->m_floatItems,&item);
    if (bVar4) {
      local_78 = (0.0 - local_78) + local_78;
    }
    else {
      pAVar6 = internalVertex(this,item,AnchorLeft);
      pAVar7 = internalVertex(this,item,AnchorRight);
      if (LVar5 == LeftToRight) {
        local_78 = ((pAVar6->distance + left) - local_78) + local_78;
        dVar11 = left + pAVar7->distance;
      }
      else {
        local_78 = ((right - pAVar7->distance) - local_78) + local_78;
        dVar11 = right - pAVar6->distance;
      }
    }
    local_68 = dVar11 - local_78;
    bVar4 = QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::contains
                      (&(this->m_floatItems).m_data[1].q_hash,&item);
    if (bVar4) {
      dStack_70 = (0.0 - dStack_70) + dStack_70;
    }
    else {
      pAVar6 = internalVertex(this,item,AnchorTop);
      pAVar7 = internalVertex(this,item,AnchorBottom);
      dStack_70 = ((pAVar6->distance + top) - dStack_70) + dStack_70;
      dVar12 = top + pAVar7->distance;
    }
    dStack_60 = dVar12 - dStack_70;
    (*item->_vptr_QGraphicsLayoutItem[2])(item,&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::setItemsGeometries(const QRectF &geom)
{
    Q_Q(QGraphicsAnchorLayout);
    AnchorVertex *firstH, *secondH, *firstV, *secondV;

    qreal top;
    qreal left;
    qreal right;

    q->getContentsMargins(&left, &top, &right, nullptr);
    const Qt::LayoutDirection visualDir = visualDirection();
    if (visualDir == Qt::RightToLeft)
        qSwap(left, right);

    left += geom.left();
    top += geom.top();
    right = geom.right() - right;

    for (QGraphicsLayoutItem *item : std::as_const(items)) {
        QRectF newGeom;
        QSizeF itemPreferredSize = item->effectiveSizeHint(Qt::PreferredSize);
        if (m_floatItems[Qt::Horizontal].contains(item)) {
            newGeom.setLeft(0);
            newGeom.setRight(itemPreferredSize.width());
        } else {
            firstH = internalVertex(item, Qt::AnchorLeft);
            secondH = internalVertex(item, Qt::AnchorRight);

            if (visualDir == Qt::LeftToRight) {
                newGeom.setLeft(left + firstH->distance);
                newGeom.setRight(left + secondH->distance);
            } else {
                newGeom.setLeft(right - secondH->distance);
                newGeom.setRight(right - firstH->distance);
            }
        }

        if (m_floatItems[Qt::Vertical].contains(item)) {
            newGeom.setTop(0);
            newGeom.setBottom(itemPreferredSize.height());
        } else {
            firstV = internalVertex(item, Qt::AnchorTop);
            secondV = internalVertex(item, Qt::AnchorBottom);

            newGeom.setTop(top + firstV->distance);
            newGeom.setBottom(top + secondV->distance);
        }

        item->setGeometry(newGeom);
    }
}